

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O3

ActionResult * __thiscall
spectest::CommandRunner::RunAction
          (ActionResult *__return_storage_ptr__,CommandRunner *this,int line_number,Action *action,
          RunVerbosity verbose)

{
  pointer *ppTVar1;
  Func *this_00;
  Store *this_01;
  iterator __position;
  Result RVar2;
  ExportMap *this_02;
  mapped_type *pmVar3;
  Index index;
  char *__function;
  undefined1 *__args;
  string_view name;
  Values *trap;
  anon_union_16_6_113bff37_for_Value_0 local_48;
  
  if ((action->module_name)._M_string_length == 0) {
    this_02 = &this->last_instance_;
  }
  else {
    this_02 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>_>_>_>
              ::operator[](&this->instances_,&action->module_name);
  }
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>
           ::operator[](this_02,&action->field_name);
  this_00 = (Func *)pmVar3->obj_;
  this_01 = pmVar3->store_;
  if (this_01 == (Store *)0x0) {
    index = 0;
  }
  else {
    index = wabt::interp::Store::CopyRoot(this_01,pmVar3->root_index_);
  }
  if (this_00 == (Func *)0x0) {
    PrintError(this,line_number,"unknown invoke \"%s.%s\"",(action->module_name)._M_dataplus._M_p,
               (action->field_name)._M_dataplus._M_p);
    (__return_storage_ptr__->trap).obj_ = (Trap *)0x0;
    (__return_storage_ptr__->trap).store_ = (Store *)0x0;
    (__return_storage_ptr__->values).
    super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->values).
    super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->types).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->values).
    super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->types).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->types).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->trap).root_index_ = 0;
  }
  else {
    (__return_storage_ptr__->trap).obj_ = (Trap *)0x0;
    (__return_storage_ptr__->trap).store_ = (Store *)0x0;
    (__return_storage_ptr__->values).
    super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->values).
    super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->types).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->values).
    super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->types).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->types).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->trap).root_index_ = 0;
    if (action->type == Get) {
      if ((this_00->super_Extern).super_Object.kind_ != Global) {
        __function = 
        "Derived *wabt::cast(Base *) [Derived = wabt::interp::Global, Base = wabt::interp::Extern]";
        goto LAB_001284ef;
      }
      local_48.i64_ =
           (u64)(this_00->type_).params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      local_48._8_8_ =
           (this_00->type_).params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::
      _M_realloc_insert<wabt::interp::Value>
                (&__return_storage_ptr__->values,(iterator)0x0,(Value *)&local_48.v128_);
      __position._M_current =
           (__return_storage_ptr__->types).
           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_finish;
      __args = &(this_00->type_).super_ExternType.field_0xc;
      if (__position._M_current ==
          (__return_storage_ptr__->types).
          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_realloc_insert<wabt::Type_const&>
                  ((vector<wabt::Type,std::allocator<wabt::Type>> *)__return_storage_ptr__,
                   __position,(Type *)__args);
      }
      else {
        *__position._M_current = *(Type *)__args;
        ppTVar1 = &(__return_storage_ptr__->types).
                   super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppTVar1 = *ppTVar1 + 1;
      }
    }
    else {
      if (action->type != Invoke) {
        abort();
      }
      if (((this_00->super_Extern).super_Object.kind_ & ~Foreign) != DefinedFunc) {
        __function = 
        "Derived *wabt::cast(Base *) [Derived = wabt::interp::Func, Base = wabt::interp::Extern]";
LAB_001284ef:
        __assert_fail("isa<Derived>(base)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/cast.h"
                      ,0x4e,__function);
      }
      trap = &__return_storage_ptr__->values;
      RVar2 = wabt::interp::Func::Call
                        (this_00,&this->store_,&action->args,trap,&__return_storage_ptr__->trap,
                         s_trace_stream);
      if ((RVar2.enum_ == Ok) == ((__return_storage_ptr__->trap).obj_ != (Trap *)0x0)) {
        __assert_fail("(ok == Result::Ok) == (!result.trap)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/spectest-interp.cc"
                      ,0x590,
                      "ActionResult spectest::CommandRunner::RunAction(int, const Action *, RunVerbosity)"
                     );
      }
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
                (&__return_storage_ptr__->types,&(this_00->type_).results);
      if (verbose == Verbose) {
        name._M_str = (char *)&this_00->type_;
        name._M_len = (size_t)(action->field_name)._M_dataplus._M_p;
        wabt::interp::WriteCall
                  ((interp *)
                   s_stdout_stream._M_t.
                   super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                   .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl,
                   (Stream *)(action->field_name)._M_string_length,name,(FuncType *)&action->args,
                   trap,(Values *)&__return_storage_ptr__->trap,(Ptr *)trap);
      }
    }
    wabt::interp::Store::DeleteRoot(this_01,index);
  }
  return __return_storage_ptr__;
}

Assistant:

ActionResult CommandRunner::RunAction(int line_number,
                                      const Action* action,
                                      RunVerbosity verbose) {
  ExportMap& module = !action->module_name.empty()
                          ? instances_[action->module_name]
                          : last_instance_;
  Extern::Ptr extern_ = module[action->field_name];
  if (!extern_) {
    PrintError(line_number, "unknown invoke \"%s.%s\"",
               action->module_name.c_str(), action->field_name.c_str());
    return {};
  }

  ActionResult result;

  switch (action->type) {
    case ActionType::Invoke: {
      auto* func = cast<interp::Func>(extern_.get());
      auto ok = func->Call(store_, action->args, result.values, &result.trap,
                           s_trace_stream);
      assert((ok == Result::Ok) == (!result.trap));
      result.types = func->type().results;
      if (verbose == RunVerbosity::Verbose) {
        WriteCall(s_stdout_stream.get(), action->field_name, func->type(),
                  action->args, result.values, result.trap);
      }
      break;
    }

    case ActionType::Get: {
      auto* global = cast<interp::Global>(extern_.get());
      result.values.push_back(global->Get());
      result.types.push_back(global->type().type);
      break;
    }

    default:
      WABT_UNREACHABLE;
  }

  return result;
}